

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecBitwiseOr(Parser *this)

{
  ulong *puVar1;
  pointer pcVar2;
  CompileContext *pCVar3;
  undefined4 uVar4;
  CompileContext *pCVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer *__ptr_2;
  pointer *__ptr;
  Parser *in_RSI;
  bool bVar7;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> rightExpr;
  Token oper;
  undefined1 local_98 [16];
  ulong *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  line_t local_68;
  col_t local_64;
  TokenType local_60;
  ulong *local_58;
  _Alloc_hider local_50;
  ulong local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  parsePrecBitwiseXor(this);
  bVar7 = (in_RSI->m_current).type == PIPE;
  if (bVar7) {
    do {
      advance(in_RSI);
      if (!bVar7) {
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      local_98._8_4_ = (in_RSI->m_previous).type;
      puVar1 = (ulong *)(local_80._M_local_buf + 8);
      pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      local_88 = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
      local_64 = (in_RSI->m_previous).col;
      local_68 = (in_RSI->m_previous).line;
      parsePrecBitwiseXor((Parser *)local_98);
      pCVar5 = (CompileContext *)operator_new(0x48);
      uVar4 = local_80._8_4_;
      pCVar3 = this->m_context;
      this->m_context = (CompileContext *)0x0;
      if (local_88 == puVar1) {
        aStack_40._M_allocated_capacity._0_4_ = uStack_70;
        aStack_40._M_allocated_capacity._4_4_ = uStack_6c;
        local_58 = &local_48;
      }
      else {
        local_58 = local_88;
      }
      local_48 = CONCAT44(local_80._12_4_,local_80._8_4_);
      local_80._8_4_ = local_80._8_4_ & 0xffffff00;
      (pCVar5->m_source)._M_dataplus._M_p = (pointer)&PTR__BinaryExpr_001295a0;
      (pCVar5->m_source)._M_string_length = (size_type)pCVar3;
      (pCVar5->m_source).field_2._M_allocated_capacity = local_98._0_8_;
      *(undefined4 *)((long)&(pCVar5->m_source).field_2 + 8) = local_98._8_4_;
      paVar6 = &(pCVar5->m_options).m_filename.field_2;
      (pCVar5->m_options).m_filename._M_dataplus._M_p = (pointer)paVar6;
      if (local_58 == &local_48) {
        *(undefined4 *)paVar6 = uVar4;
        *(undefined4 *)((long)&(pCVar5->m_options).m_filename.field_2 + 4) = local_80._12_4_;
        *(undefined4 *)((long)&(pCVar5->m_options).m_filename.field_2 + 8) =
             aStack_40._M_allocated_capacity._0_4_;
        *(undefined4 *)((long)&(pCVar5->m_options).m_filename.field_2 + 0xc) =
             aStack_40._M_allocated_capacity._4_4_;
      }
      else {
        (pCVar5->m_options).m_filename._M_dataplus._M_p = (pointer)local_58;
        (pCVar5->m_options).m_filename.field_2._M_allocated_capacity = local_48;
      }
      (pCVar5->m_options).m_filename._M_string_length = local_80._M_allocated_capacity;
      local_48 = local_48 & 0xffffffffffffff00;
      *(col_t *)((long)&(pCVar5->m_options).m_programArgs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4) = local_64;
      *(line_t *)
       &(pCVar5->m_options).m_programArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_68;
      this->m_context = pCVar5;
      aStack_40._12_2_ = local_64;
      aStack_40._8_4_ = local_68;
      local_50._M_p = (pointer)0x0;
      local_60 = local_98._8_4_;
      local_80._M_allocated_capacity = 0;
      local_98._0_8_ = (CompileContext *)0x0;
      bVar7 = (in_RSI->m_current).type == PIPE;
      local_88 = puVar1;
      local_58 = &local_48;
    } while (bVar7);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecBitwiseOr() {
        std::unique_ptr<Expr> expr = parsePrecBitwiseXor();

        while (consume(TokenType::PIPE)) {
            Token oper = m_previous;
            std::unique_ptr<Expr> rightExpr = parsePrecBitwiseXor();
            expr = std::make_unique<BinaryExpr>(std::move(expr), std::move(rightExpr), std::move(oper));
        }

        return expr;
    }